

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb_hexamine.cc
# Opt level: O0

int parse_options(int argc,char **argv,input_option *opt)

{
  int iVar1;
  undefined8 *in_RDX;
  long in_RSI;
  int in_EDI;
  int i;
  int local_1c;
  int local_4;
  
  if (in_EDI < 2) {
    print_usage();
    local_4 = -1;
  }
  else {
    for (local_1c = 1; local_1c < in_EDI; local_1c = local_1c + 1) {
      if ((**(char **)(in_RSI + (long)local_1c * 8) == '-') &&
         (*(char *)(*(long *)(in_RSI + (long)local_1c * 8) + 1) == '-')) {
        iVar1 = strncmp(*(char **)(in_RSI + (long)local_1c * 8),"--print-header",0x10);
        if (iVar1 == 0) {
          *(undefined1 *)(in_RDX + 1) = 1;
        }
        else {
          iVar1 = strncmp(*(char **)(in_RSI + (long)local_1c * 8),"--headers-only",0x10);
          if (iVar1 == 0) {
            *(undefined1 *)((long)in_RDX + 9) = 1;
          }
          else {
            iVar1 = strncmp(*(char **)(in_RSI + (long)local_1c * 8),"--max-filesize",0x10);
            if (iVar1 != 0) {
              printf("\nUnknown option %s\n",*(undefined8 *)(in_RSI + (long)local_1c * 8));
              print_usage();
              return -2;
            }
            local_1c = local_1c + 1;
            __isoc99_sscanf(*(undefined8 *)(in_RSI + (long)local_1c * 8),"%lu",in_RDX + 2);
          }
        }
      }
      else {
        *in_RDX = *(undefined8 *)(in_RSI + (long)local_1c * 8);
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int parse_options(int argc, char **argv, struct input_option *opt)
{
    // Unfortunately, we cannot use getopt generally
    // because Windows doesn't support it ..
    int i = 1;

    if (argc < 2) {
        print_usage();
        return -1;
    }

    for (i = 1; i < argc; ++i) {
        if (argv[i][0] == '-' && argv[i][1] == '-') {
            if (strncmp(argv[i], "--print-header", 16) == 0) {
                opt->print_header = true;
            } else if (strncmp(argv[i], "--headers-only", 16) == 0) {
                opt->headers_only = true;
            } else if (strncmp(argv[i], "--max-filesize", 16) == 0) {
                sscanf(argv[++i], "%" _F64, &opt->max_filesize);
            } else {
                printf("\nUnknown option %s\n", argv[i]);
                print_usage();
                return -2;
            }
        } else {
            opt->filename = argv[i];
        }
    }

    return 0;
}